

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

bool __thiscall sf::priv::RenderTextureImplFBO::createFrameBuffer(RenderTextureImplFBO *this)

{
  GLenum GVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  Lock lock;
  GLuint multisampleFrameBuffer;
  GLuint frameBuffer;
  Lock local_50;
  GLuint local_48;
  GLuint local_44;
  pair<unsigned_long_long,_unsigned_int> local_40;
  
  local_44 = 0;
  (*sf_ptrc_glGenFramebuffersEXT)(1,&local_44);
  glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
               ,0x193,"GLEXT_glGenFramebuffers(1, &frameBuffer)");
  if (local_44 == 0) {
    poVar2 = err();
    pcVar4 = "Impossible to create render texture (failed to create the frame buffer object)";
    lVar3 = 0x4e;
  }
  else {
    (*sf_ptrc_glBindFramebufferEXT)(0x8d40,local_44);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x19a,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer)");
    if ((this->m_multisample == false) && (this->m_depthStencilBuffer != 0)) {
      (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d00,0x8d41,this->m_depthStencilBuffer);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x19f,
                   "GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)"
                  );
      if (this->m_stencil == true) {
        (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d20,0x8d41,this->m_depthStencilBuffer);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x1a5,
                     "GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)"
                    );
      }
    }
    (*sf_ptrc_glFramebufferTexture2DEXT)(0x8d40,0x8ce0,0xde1,this->m_textureId,0);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x1ad,
                 "GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_textureId, 0)"
                );
    GVar1 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8d40);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x1b1,"status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER)");
    if (GVar1 != 0x8cd5) {
      (*sf_ptrc_glBindFramebufferEXT)(0x8d40,0);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1b4,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0)");
      (*sf_ptrc_glDeleteFramebuffersEXT)(1,&local_44);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1b5,"GLEXT_glDeleteFramebuffers(1, &frameBuffer)");
      poVar2 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 "Impossible to create render texture (failed to link the target texture to the frame buffer)"
                 ,0x5b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return false;
    }
    Lock::Lock(&local_50,(Mutex *)&(anonymous_namespace)::mutex);
    local_40.first = Context::getActiveContextId();
    local_40.second = local_44;
    std::
    _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<unsigned_long_long,unsigned_int>>
              ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
                *)&this->m_frameBuffers,&local_40);
    Lock::~Lock(&local_50);
    if (this->m_multisample != true) {
      return true;
    }
    local_48 = 0;
    (*sf_ptrc_glGenFramebuffersEXT)(1,&local_48);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x1c7,"GLEXT_glGenFramebuffers(1, &multisampleFrameBuffer)");
    if (local_48 == 0) {
      poVar2 = err();
      pcVar4 = 
      "Impossible to create render texture (failed to create the multisample frame buffer object)";
      lVar3 = 0x5a;
    }
    else {
      (*sf_ptrc_glBindFramebufferEXT)(0x8d40,local_48);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1ce,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, multisampleFrameBuffer)");
      (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_colorBuffer);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1d1,"GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer)");
      (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8ce0,0x8d41,this->m_colorBuffer);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1d2,
                   "GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GLEXT_GL_RENDERBUFFER, m_colorBuffer)"
                  );
      if (this->m_depthStencilBuffer != 0) {
        (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d00,0x8d41,this->m_depthStencilBuffer);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x1d7,
                     "GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)"
                    );
        if (this->m_stencil == true) {
          (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d20,0x8d41,this->m_depthStencilBuffer);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x1db,
                       "GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)"
                      );
        }
      }
      GVar1 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8d40);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1e0,"status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER)");
      if (GVar1 == 0x8cd5) {
        Lock::Lock(&local_50,(Mutex *)&(anonymous_namespace)::mutex);
        local_40.first = Context::getActiveContextId();
        local_40.second = local_48;
        std::
        _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
        ::_M_emplace_unique<std::pair<unsigned_long_long,unsigned_int>>
                  ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
                    *)&this->m_multisampleFrameBuffers,&local_40);
        Lock::~Lock(&local_50);
        return true;
      }
      (*sf_ptrc_glBindFramebufferEXT)(0x8d40,0);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1e3,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0)");
      (*sf_ptrc_glDeleteFramebuffersEXT)(1,&local_48);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x1e4,"GLEXT_glDeleteFramebuffers(1, &multisampleFrameBuffer)");
      poVar2 = err();
      pcVar4 = 
      "Impossible to create render texture (failed to link the render buffers to the multisample frame buffer)"
      ;
      lVar3 = 0x67;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool RenderTextureImplFBO::createFrameBuffer()
{
    // Create the framebuffer object
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));

    if (!frameBuffer)
    {
        err() << "Impossible to create render texture (failed to create the frame buffer object)" << std::endl;
        return false;
    }
    glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));

    // Link the depth/stencil renderbuffer to the frame buffer
    if (!m_multisample && m_depthStencilBuffer)
    {
        glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));

#ifndef SFML_OPENGL_ES

        if (m_stencil)
        {
            glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
        }

#endif

    }

    // Link the texture to the frame buffer
    glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_textureId, 0));

    // A final check, just to be sure...
    GLenum status;
    glCheck(status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER));
    if (status != GLEXT_GL_FRAMEBUFFER_COMPLETE)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));
        err() << "Impossible to create render texture (failed to link the target texture to the frame buffer)" << std::endl;
        return false;
    }

    {
        Lock lock(mutex);

        // Insert the FBO into our map
        m_frameBuffers.insert(std::make_pair(Context::getActiveContextId(), static_cast<unsigned int>(frameBuffer)));
    }

#ifndef SFML_OPENGL_ES

    if (m_multisample)
    {
        // Create the multisample framebuffer object
        GLuint multisampleFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &multisampleFrameBuffer));

        if (!multisampleFrameBuffer)
        {
            err() << "Impossible to create render texture (failed to create the multisample frame buffer object)" << std::endl;
            return false;
        }
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, multisampleFrameBuffer));

        // Link the multisample color buffer to the frame buffer
        glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
        glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GLEXT_GL_RENDERBUFFER, m_colorBuffer));

        // Link the depth/stencil renderbuffer to the frame buffer
        if (m_depthStencilBuffer)
        {
            glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));

            if (m_stencil)
            {
                glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
            }
        }

        // A final check, just to be sure...
        glCheck(status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER));
        if (status != GLEXT_GL_FRAMEBUFFER_COMPLETE)
        {
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
            glCheck(GLEXT_glDeleteFramebuffers(1, &multisampleFrameBuffer));
            err() << "Impossible to create render texture (failed to link the render buffers to the multisample frame buffer)" << std::endl;
            return false;
        }

        {
            Lock lock(mutex);

            // Insert the FBO into our map
            m_multisampleFrameBuffers.insert(std::make_pair(Context::getActiveContextId(), static_cast<unsigned int>(multisampleFrameBuffer)));
        }
    }

#endif

    return true;
}